

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseOptions
          (Parser *this,LocationRecorder *parent_location,int optionsFieldNumber,
          Message *mutable_options)

{
  bool bVar1;
  undefined1 local_78 [8];
  LocationRecorder location;
  allocator<char> local_51;
  string local_50;
  Message *local_30;
  Message *mutable_options_local;
  LocationRecorder *pLStack_20;
  int optionsFieldNumber_local;
  LocationRecorder *parent_location_local;
  Parser *this_local;
  
  local_30 = mutable_options;
  mutable_options_local._4_4_ = optionsFieldNumber;
  pLStack_20 = parent_location;
  parent_location_local = (LocationRecorder *)this;
  ConsumeEndOfDeclaration(this,"{",parent_location);
  while( true ) {
    bVar1 = TryConsumeEndOfDeclaration(this,"}",(LocationRecorder *)0x0);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return true;
    }
    bVar1 = AtEnd(this);
    if (bVar1) break;
    bVar1 = TryConsumeEndOfDeclaration(this,";",(LocationRecorder *)0x0);
    if (!bVar1) {
      LocationRecorder::LocationRecorder
                ((LocationRecorder *)local_78,pLStack_20,mutable_options_local._4_4_);
      bVar1 = ParseOption(this,local_30,(LocationRecorder *)local_78,OPTION_STATEMENT);
      if (!bVar1) {
        SkipStatement(this);
      }
      LocationRecorder::~LocationRecorder((LocationRecorder *)local_78);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Reached end of input in method options (missing \'}\').",&local_51
            );
  AddError(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  return false;
}

Assistant:

bool Parser::ParseOptions(const LocationRecorder& parent_location,
                          const int optionsFieldNumber,
                          Message* mutable_options) {
  // Options!
  ConsumeEndOfDeclaration("{", &parent_location);
  while (!TryConsumeEndOfDeclaration("}", NULL)) {
    if (AtEnd()) {
      AddError("Reached end of input in method options (missing '}').");
      return false;
    }

    if (TryConsumeEndOfDeclaration(";", NULL)) {
      // empty statement; ignore
    } else {
      LocationRecorder location(parent_location,
                                optionsFieldNumber);
      if (!ParseOption(mutable_options, location, OPTION_STATEMENT)) {
        // This statement failed to parse.  Skip it, but keep looping to
        // parse other statements.
        SkipStatement();
      }
    }
  }

  return true;
}